

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrAlgo.cpp
# Opt level: O2

int NULLC::SafeSprintf(char *dst,size_t size,char *src,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  if (size == 0) {
    iVar1 = 0;
  }
  else {
    local_d8 = local_c8;
    local_e0 = &args[0].overflow_arg_area;
    local_e8 = 0x3000000018;
    local_b0 = in_RCX;
    local_a8 = in_R8;
    local_a0 = in_R9;
    iVar1 = vsnprintf(dst,size,src,&local_e8);
    dst[size - 1] = '\0';
    if (size <= (ulong)(long)iVar1) {
      iVar1 = (int)size;
    }
  }
  return iVar1;
}

Assistant:

int	NULLC::SafeSprintf(char* dst, size_t size, const char* src, ...)
{
	if(size == 0)
		return 0;

	va_list args;
	va_start(args, src);

	int result = vsnprintf(dst, size, src, args);
	dst[size - 1] = '\0';

	va_end(args);

	return (result == -1 || (size_t)result >= size) ? (int)size : result;
}